

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::getPartials
          (BeagleCPUImpl<float,_1,_0> *this,int bufferIndex,int cumulativeScaleIndex,
          double *outPartials)

{
  float *pfVar1;
  double *pdVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  ulong uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  float *pfVar18;
  int iVar19;
  double *pdVar20;
  long lVar21;
  int iVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  double dVar29;
  
  iVar16 = -5;
  if ((-1 < bufferIndex) && (iVar16 = -5, bufferIndex < *(int *)&(this->super_BeagleImpl).field_0xc)
     ) {
    iVar16 = this->kPatternCount;
    iVar22 = this->kPaddedPatternCount;
    iVar19 = iVar22 - iVar16;
    if ((iVar19 == 0) && (this->kStateCount == this->kPartialsPaddedStateCount)) {
      uVar3 = this->kPartialsSize;
      if ((ulong)uVar3 != 0) {
        pfVar18 = this->gPartials[(uint)bufferIndex];
        auVar26 = vpbroadcastq_avx512f();
        uVar17 = 0;
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          auVar28 = vpbroadcastq_avx512f();
          auVar28 = vporq_avx512f(auVar28,auVar27);
          uVar12 = vpcmpuq_avx512f(auVar28,auVar26,2);
          pfVar1 = pfVar18 + uVar17;
          auVar23._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * (int)pfVar1[1];
          auVar23._0_4_ = (uint)((byte)uVar12 & 1) * (int)*pfVar1;
          auVar23._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * (int)pfVar1[2];
          auVar23._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * (int)pfVar1[3];
          auVar23._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * (int)pfVar1[4];
          auVar23._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * (int)pfVar1[5];
          auVar23._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * (int)pfVar1[6];
          auVar23._28_4_ = (uint)(byte)(uVar12 >> 7) * (int)pfVar1[7];
          auVar28 = vcvtps2pd_avx512f(auVar23);
          pdVar20 = outPartials + uVar17;
          bVar5 = (bool)((byte)uVar12 & 1);
          bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
          bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
          bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
          bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
          bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
          bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
          *pdVar20 = (double)((ulong)bVar5 * auVar28._0_8_ | (ulong)!bVar5 * (long)*pdVar20);
          pdVar20[1] = (double)((ulong)bVar6 * auVar28._8_8_ | (ulong)!bVar6 * (long)pdVar20[1]);
          pdVar20[2] = (double)((ulong)bVar7 * auVar28._16_8_ | (ulong)!bVar7 * (long)pdVar20[2]);
          pdVar20[3] = (double)((ulong)bVar8 * auVar28._24_8_ | (ulong)!bVar8 * (long)pdVar20[3]);
          pdVar20[4] = (double)((ulong)bVar9 * auVar28._32_8_ | (ulong)!bVar9 * (long)pdVar20[4]);
          pdVar20[5] = (double)((ulong)bVar10 * auVar28._40_8_ | (ulong)!bVar10 * (long)pdVar20[5]);
          pdVar20[6] = (double)((ulong)bVar11 * auVar28._48_8_ | (ulong)!bVar11 * (long)pdVar20[6]);
          pdVar20[7] = (double)((uVar12 >> 7) * auVar28._56_8_ |
                               (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar20[7]);
          uVar17 = uVar17 + 8;
        } while (((ulong)uVar3 + 7 & 0xfffffffffffffff8) != uVar17);
      }
    }
    else {
      uVar3 = this->kStateCount;
      uVar13 = this->kPartialsPaddedStateCount;
      iVar4 = this->kCategoryCount;
      if (uVar3 == uVar13) {
        if (0 < iVar4) {
          pfVar18 = this->gPartials[(uint)bufferIndex];
          uVar13 = iVar16 * uVar3;
          auVar26 = vpbroadcastq_avx512f();
          iVar16 = 0;
          auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          pdVar20 = outPartials;
          do {
            if (uVar13 != 0) {
              uVar17 = 0;
              do {
                auVar28 = vpbroadcastq_avx512f();
                auVar28 = vporq_avx512f(auVar28,auVar27);
                uVar12 = vpcmpuq_avx512f(auVar28,auVar26,2);
                pfVar1 = pfVar18 + uVar17;
                auVar24._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * (int)pfVar1[1];
                auVar24._0_4_ = (uint)((byte)uVar12 & 1) * (int)*pfVar1;
                auVar24._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * (int)pfVar1[2];
                auVar24._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * (int)pfVar1[3];
                auVar24._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * (int)pfVar1[4];
                auVar24._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * (int)pfVar1[5];
                auVar24._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * (int)pfVar1[6];
                auVar24._28_4_ = (uint)(byte)(uVar12 >> 7) * (int)pfVar1[7];
                auVar28 = vcvtps2pd_avx512f(auVar24);
                pdVar2 = pdVar20 + uVar17;
                bVar5 = (bool)((byte)uVar12 & 1);
                bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
                bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
                bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
                bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
                *pdVar2 = (double)((ulong)bVar5 * auVar28._0_8_ | (ulong)!bVar5 * (long)*pdVar2);
                pdVar2[1] = (double)((ulong)bVar6 * auVar28._8_8_ | (ulong)!bVar6 * (long)pdVar2[1])
                ;
                pdVar2[2] = (double)((ulong)bVar7 * auVar28._16_8_ | (ulong)!bVar7 * (long)pdVar2[2]
                                    );
                pdVar2[3] = (double)((ulong)bVar8 * auVar28._24_8_ | (ulong)!bVar8 * (long)pdVar2[3]
                                    );
                pdVar2[4] = (double)((ulong)bVar9 * auVar28._32_8_ | (ulong)!bVar9 * (long)pdVar2[4]
                                    );
                pdVar2[5] = (double)((ulong)bVar10 * auVar28._40_8_ |
                                    (ulong)!bVar10 * (long)pdVar2[5]);
                pdVar2[6] = (double)((ulong)bVar11 * auVar28._48_8_ |
                                    (ulong)!bVar11 * (long)pdVar2[6]);
                pdVar2[7] = (double)((uVar12 >> 7) * auVar28._56_8_ |
                                    (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar2[7]);
                uVar17 = uVar17 + 8;
              } while (((ulong)uVar13 + 7 & 0xfffffffffffffff8) != uVar17);
            }
            iVar16 = iVar16 + 1;
            pfVar18 = pfVar18 + (int)(iVar22 * uVar3);
            pdVar20 = pdVar20 + (int)uVar13;
          } while (iVar16 != iVar4);
        }
      }
      else if (0 < iVar4) {
        pfVar18 = this->gPartials[(uint)bufferIndex];
        auVar26 = vpbroadcastq_avx512f();
        iVar22 = 0;
        auVar27 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        pdVar20 = outPartials;
        do {
          if (0 < iVar16) {
            iVar15 = 0;
            do {
              if ((ulong)uVar3 != 0) {
                uVar17 = 0;
                do {
                  auVar28 = vpbroadcastq_avx512f();
                  auVar28 = vporq_avx512f(auVar28,auVar27);
                  uVar12 = vpcmpuq_avx512f(auVar28,auVar26,2);
                  pfVar1 = pfVar18 + uVar17;
                  auVar25._4_4_ = (uint)((byte)(uVar12 >> 1) & 1) * (int)pfVar1[1];
                  auVar25._0_4_ = (uint)((byte)uVar12 & 1) * (int)*pfVar1;
                  auVar25._8_4_ = (uint)((byte)(uVar12 >> 2) & 1) * (int)pfVar1[2];
                  auVar25._12_4_ = (uint)((byte)(uVar12 >> 3) & 1) * (int)pfVar1[3];
                  auVar25._16_4_ = (uint)((byte)(uVar12 >> 4) & 1) * (int)pfVar1[4];
                  auVar25._20_4_ = (uint)((byte)(uVar12 >> 5) & 1) * (int)pfVar1[5];
                  auVar25._24_4_ = (uint)((byte)(uVar12 >> 6) & 1) * (int)pfVar1[6];
                  auVar25._28_4_ = (uint)(byte)(uVar12 >> 7) * (int)pfVar1[7];
                  auVar28 = vcvtps2pd_avx512f(auVar25);
                  pdVar2 = pdVar20 + uVar17;
                  bVar5 = (bool)((byte)uVar12 & 1);
                  bVar6 = (bool)((byte)(uVar12 >> 1) & 1);
                  bVar7 = (bool)((byte)(uVar12 >> 2) & 1);
                  bVar8 = (bool)((byte)(uVar12 >> 3) & 1);
                  bVar9 = (bool)((byte)(uVar12 >> 4) & 1);
                  bVar10 = (bool)((byte)(uVar12 >> 5) & 1);
                  bVar11 = (bool)((byte)(uVar12 >> 6) & 1);
                  *pdVar2 = (double)((ulong)bVar5 * auVar28._0_8_ | (ulong)!bVar5 * (long)*pdVar2);
                  pdVar2[1] = (double)((ulong)bVar6 * auVar28._8_8_ |
                                      (ulong)!bVar6 * (long)pdVar2[1]);
                  pdVar2[2] = (double)((ulong)bVar7 * auVar28._16_8_ |
                                      (ulong)!bVar7 * (long)pdVar2[2]);
                  pdVar2[3] = (double)((ulong)bVar8 * auVar28._24_8_ |
                                      (ulong)!bVar8 * (long)pdVar2[3]);
                  pdVar2[4] = (double)((ulong)bVar9 * auVar28._32_8_ |
                                      (ulong)!bVar9 * (long)pdVar2[4]);
                  pdVar2[5] = (double)((ulong)bVar10 * auVar28._40_8_ |
                                      (ulong)!bVar10 * (long)pdVar2[5]);
                  pdVar2[6] = (double)((ulong)bVar11 * auVar28._48_8_ |
                                      (ulong)!bVar11 * (long)pdVar2[6]);
                  pdVar2[7] = (double)((uVar12 >> 7) * auVar28._56_8_ |
                                      (ulong)!SUB81(uVar12 >> 7,0) * (long)pdVar2[7]);
                  uVar17 = uVar17 + 8;
                } while (((ulong)uVar3 + 7 & 0xfffffffffffffff8) != uVar17);
              }
              pdVar20 = pdVar20 + (int)uVar3;
              pfVar18 = pfVar18 + (int)uVar13;
              iVar15 = iVar15 + 1;
            } while (iVar15 != iVar16);
          }
          pfVar18 = pfVar18 + (int)(iVar19 * uVar13);
          iVar22 = iVar22 + 1;
        } while (iVar22 != iVar4);
      }
    }
    iVar16 = 0;
    if ((cumulativeScaleIndex != -1) && (0 < this->kPatternCount)) {
      pfVar18 = this->gScaleBuffers[cumulativeScaleIndex];
      lVar21 = 0;
      iVar16 = 0;
      do {
        dVar29 = exp((double)pfVar18[lVar21]);
        iVar22 = this->kStateCount;
        if (0 < iVar22) {
          lVar14 = 0;
          do {
            outPartials[iVar16 + lVar14] = (double)(float)dVar29 * outPartials[iVar16 + lVar14];
            lVar14 = lVar14 + 1;
          } while (iVar22 != (int)lVar14);
          iVar16 = iVar16 + (int)lVar14;
        }
        lVar21 = lVar21 + 1;
      } while (lVar21 < this->kPatternCount);
      iVar16 = 0;
    }
  }
  return iVar16;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::getPartials(int bufferIndex,
                               int cumulativeScaleIndex,
                               double* outPartials) {

    // TODO: Test with and without padding
    if (bufferIndex < 0 || bufferIndex >= kBufferCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;

    if ((kPatternCount == kPaddedPatternCount) && (kStateCount == kPartialsPaddedStateCount)) {
        beagleMemCpy(outPartials, gPartials[bufferIndex], kPartialsSize);
    } else if (kStateCount == kPartialsPaddedStateCount) {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kPatternCount * kStateCount);
            offsetOutPartials += kPatternCount * kStateCount;
            offsetBeaglePartials += kPaddedPatternCount * kStateCount;
        }
    } else {
        double *offsetOutPartials = outPartials;
        REALTYPE* offsetBeaglePartials = gPartials[bufferIndex];
        for(int l = 0; l < kCategoryCount; l++) {
            for (int i = 0; i < kPatternCount; i++) {
                beagleMemCpy(offsetOutPartials, offsetBeaglePartials, kStateCount);
                offsetOutPartials += kStateCount;
                offsetBeaglePartials += kPartialsPaddedStateCount;
            }
            offsetBeaglePartials += (kPaddedPatternCount - kPatternCount) * kPartialsPaddedStateCount;
        }
    }

    if (cumulativeScaleIndex != BEAGLE_OP_NONE) {
        REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScaleIndex];
        int index = 0;
        for(int k=0; k<kPatternCount; k++) {
            REALTYPE scaleFactor = exp(cumulativeScaleBuffer[k]);
            for(int i=0; i<kStateCount; i++) {
                outPartials[index] *= scaleFactor;
                index++;
            }
        }
        // TODO: Do we assume the cumulativeScaleBuffer is on the log-scale?
    }

    return BEAGLE_SUCCESS;
}